

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O1

void __thiscall
duckdb::roaring::RoaringCompressState::InitializeContainer(RoaringCompressState *this)

{
  idx_t iVar1;
  __int_type _Var2;
  bool bVar3;
  reference pvVar4;
  pointer pCVar5;
  validity_t *pvVar6;
  code *pcVar7;
  uint uVar8;
  data_ptr_t pdVar9;
  uint uVar10;
  ulong uVar11;
  value_type metadata;
  value_type local_2c;
  
  if (this->total_count != this->analyze_state->total_count) {
    pvVar4 = vector<duckdb::roaring::ContainerMetadata,_true>::operator[]
                       (this->container_metadata,this->total_count >> 0xb);
    local_2c = *pvVar4;
    uVar11 = this->analyze_state->total_count - (ulong)(this->container_state).appended_count;
    if (0x7ff < uVar11) {
      uVar11 = 0x800;
    }
    uVar10 = (uint)(uVar11 + 0x3f);
    bVar3 = CanStore(this,(ulong)(uVar10 & 0x1fc0),&local_2c);
    if (!bVar3) {
      pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->current_segment);
      iVar1 = (pCVar5->super_SegmentBase<duckdb::ColumnSegment>).start;
      pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->current_segment);
      _Var2 = (pCVar5->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>._M_i;
      FlushSegment(this);
      CreateEmptySegment(this,_Var2 + iVar1);
    }
    uVar8 = (uint)local_2c & 0xff;
    if (local_2c.container_type == RUN_CONTAINER) {
      (this->container_state).append_function = AppendRun;
      pdVar9 = this->data_ptr;
      if (local_2c.count < 4) {
        this->data_ptr = (data_ptr_t)((ulong)(pdVar9 + 3) & 0xfffffffffffffffc);
        (this->container_state).runs =
             (RunContainerRLEPair *)((ulong)(pdVar9 + 3) & 0xfffffffffffffffc);
      }
      else {
        pdVar9[0] = '\0';
        pdVar9[1] = '\0';
        pdVar9[2] = '\0';
        pdVar9[3] = '\0';
        pdVar9[4] = '\0';
        pdVar9[5] = '\0';
        pdVar9[6] = '\0';
        pdVar9[7] = '\0';
        pdVar9 = this->data_ptr;
        (this->container_state).run_counts = pdVar9;
        (this->container_state).compressed_runs = pdVar9 + 8;
      }
    }
    else if (uVar8 == 2) {
      pdVar9 = (data_ptr_t)((ulong)(this->data_ptr + 7) & 0xfffffffffffffff8);
      this->data_ptr = pdVar9;
      FastMemset(pdVar9,-1,(ulong)((uint)(uVar11 + 0x3f >> 3) & 0x3f8));
      (this->container_state).append_function = AppendBitset;
      pvVar6 = (validity_t *)((ulong)(this->data_ptr + 7) & 0xfffffffffffffff8);
      this->data_ptr = (data_ptr_t)pvVar6;
      (this->container_state).uncompressed = pvVar6;
    }
    else {
      uVar11 = (ulong)local_2c.nulls;
      if (uVar11 == 0) {
        pcVar7 = AppendToArray<false>;
      }
      else {
        pcVar7 = AppendToArray<true>;
      }
      (this->container_state).append_function = pcVar7;
      pdVar9 = this->data_ptr;
      if (local_2c.count < 8) {
        this->data_ptr = (data_ptr_t)((ulong)(pdVar9 + 1) & 0xfffffffffffffffe);
        (this->container_state).arrays[uVar11] =
             (uint16_t *)((ulong)(pdVar9 + 1) & 0xfffffffffffffffe);
      }
      else {
        pdVar9[0] = '\0';
        pdVar9[1] = '\0';
        pdVar9[2] = '\0';
        pdVar9[3] = '\0';
        pdVar9[4] = '\0';
        pdVar9[5] = '\0';
        pdVar9[6] = '\0';
        pdVar9[7] = '\0';
        pdVar9 = this->data_ptr;
        (this->container_state).array_counts[uVar11] = pdVar9;
        (this->container_state).compressed_arrays[uVar11] = pdVar9 + 8;
      }
    }
    if (uVar8 == 0) {
      uVar11 = (ulong)((uint)local_2c.count * 4);
      if (3 < local_2c.count) {
        uVar11 = (ulong)local_2c.count * 2 + 8;
      }
    }
    else if (uVar8 == 2) {
      uVar11 = (ulong)(uVar10 >> 3 & 0x3f8);
    }
    else {
      uVar11 = (ulong)((uint)local_2c.count + (uint)local_2c.count);
      if (7 < local_2c.count) {
        uVar11 = (ulong)local_2c.count + 8;
      }
    }
    this->data_ptr = this->data_ptr + uVar11;
    ContainerMetadataCollection::AddMetadata(&this->metadata_collection,local_2c);
  }
  return;
}

Assistant:

void RoaringCompressState::InitializeContainer() {
	if (total_count == analyze_state.total_count) {
		// No more containers left
		return;
	}
	auto container_index = GetContainerIndex();
	D_ASSERT(container_index < container_metadata.size());
	auto metadata = container_metadata[container_index];

	idx_t container_size = AlignValue<idx_t, ValidityMask::BITS_PER_VALUE>(
	    MinValue<idx_t>(analyze_state.total_count - container_state.appended_count, ROARING_CONTAINER_SIZE));
	if (!CanStore(container_size, metadata)) {
		idx_t row_start = current_segment->start + current_segment->count;
		FlushSegment();
		CreateEmptySegment(row_start);
	}

	// Override the pointer to write directly into the block
	if (metadata.IsUncompressed()) {
		data_ptr = reinterpret_cast<data_ptr_t>(AlignValue<idx_t>(reinterpret_cast<idx_t>(data_ptr)));
		FastMemset(data_ptr, ~0, sizeof(validity_t) * (container_size / ValidityMask::BITS_PER_VALUE));
		container_state.OverrideUncompressed(data_ptr);
	} else if (metadata.IsRun()) {
		auto number_of_runs = metadata.NumberOfRuns();
		container_state.OverrideRun(data_ptr, number_of_runs);
	} else {
		auto cardinality = metadata.Cardinality();
		container_state.OverrideArray(data_ptr, metadata.IsInverted(), cardinality);
	}
	data_ptr += metadata.GetDataSizeInBytes(container_size);
	metadata_collection.AddMetadata(metadata);
}